

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_json_read_invalid_json(void)

{
  long lVar1;
  undefined8 uVar2;
  bson_json_error_code_t in_EDX;
  
  test_bson_json_error("{ \n      \"foo\" : { \n   }",1,in_EDX);
  lVar1 = bson_new_from_json("1",1,0);
  if (lVar1 == 0) {
    lVar1 = bson_new_from_json("*",1,0);
    if (lVar1 == 0) {
      lVar1 = bson_new_from_json("",0,0);
      if (lVar1 == 0) {
        lVar1 = bson_new_from_json("asdfasdf",0xffffffffffffffff,0);
        if (lVar1 == 0) {
          lVar1 = bson_new_from_json("{\"a\":*}",0xffffffffffffffff,0);
          if (lVar1 == 0) {
            return;
          }
          uVar2 = 0x577;
        }
        else {
          uVar2 = 0x574;
        }
      }
      else {
        uVar2 = 0x571;
      }
    }
    else {
      uVar2 = 0x56e;
    }
  }
  else {
    uVar2 = 0x56b;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uVar2,"test_bson_json_read_invalid_json","!b");
  abort();
}

Assistant:

static void
test_bson_json_read_invalid_json (void)
{
   const char *json = "{ \n\
      \"foo\" : { \n\
   }";
   bson_t *b;

   test_bson_json_error (
      json, BSON_ERROR_JSON, BSON_JSON_ERROR_READ_CORRUPT_JS);

   b = bson_new_from_json ((uint8_t *) "1", 1, NULL);
   BSON_ASSERT (!b);

   b = bson_new_from_json ((uint8_t *) "*", 1, NULL);
   BSON_ASSERT (!b);

   b = bson_new_from_json ((uint8_t *) "", 0, NULL);
   BSON_ASSERT (!b);

   b = bson_new_from_json ((uint8_t *) "asdfasdf", -1, NULL);
   BSON_ASSERT (!b);

   b = bson_new_from_json ((uint8_t *) "{\"a\":*}", -1, NULL);
   BSON_ASSERT (!b);
}